

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_tree.cpp
# Opt level: O3

MatchTool * generate_Dtran(MatchTool *__return_storage_ptr__,RegexTree *tree)

{
  char cVar1;
  _Hash_node_base *p_Var2;
  _Hash_node_base *p_Var3;
  int *piVar4;
  pointer piVar5;
  pointer pDVar6;
  MatchTool *pMVar7;
  int iVar8;
  __node_base _Var9;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> _Var10;
  ulong uVar11;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var12;
  undefined8 uVar13;
  long lVar14;
  ulong uVar15;
  pointer pDVar16;
  Dstate *pDVar17;
  int *piVar18;
  long lVar19;
  pointer piVar20;
  int *piVar21;
  __node_base _Var22;
  size_t sVar23;
  iterator iVar24;
  ulong uVar25;
  vector<int,_std::allocator<int>_> tmp;
  vector<Dstate,_std::allocator<Dstate>_> Dstates;
  vector<int,_std::allocator<int>_> targets;
  int j;
  vector<int,_std::allocator<int>_> firstpos;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  Dtran;
  vector<const_tree_node_*,_std::allocator<const_tree_node_*>_> table;
  StateMap mp;
  FollowPos fp;
  StateSet first_set;
  bool alphabet [256];
  int *local_2e8;
  iterator iStack_2e0;
  int *local_2d8;
  vector<Dstate,_std::allocator<Dstate>_> local_2c8;
  int local_2ac;
  vector<int,_std::allocator<int>_> local_2a8;
  ulong local_288;
  ulong local_280;
  value_type local_278;
  vector<int,_std::allocator<int>_> local_258;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_238;
  int *local_218;
  ulong local_210;
  int *local_208;
  vector<const_tree_node_*,_std::allocator<const_tree_node_*>_> local_200;
  MatchTool *local_1e8;
  Dstate *local_1e0;
  int *local_1d8;
  long local_1d0;
  Dstate *local_1c8;
  _Hashtable<const_tree_node_*,_std::pair<const_tree_node_*const,_int>,_std::allocator<std::pair<const_tree_node_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<const_tree_node_*>,_std::hash<const_tree_node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_1c0;
  FollowPos local_188;
  _Hashtable<const_tree_node_*,_const_tree_node_*,_std::allocator<const_tree_node_*>,_std::__detail::_Identity,_std::equal_to<const_tree_node_*>,_std::hash<const_tree_node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_170;
  value_type local_138 [8];
  
  local_138[0].mark = -1;
  local_138[0]._4_4_ = 0;
  local_138[0].states.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_138[0].states.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_138[0].states.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<Dstate,_std::allocator<Dstate>_>::vector
            (&local_2c8,1,local_138,(allocator_type *)&local_1c0);
  if (local_138[0].states.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_138[0].states.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_138[0].states.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_138[0].states.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_238.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_238.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_238.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_2a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_2a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (int *)0x0;
  local_1c0._M_buckets = &local_1c0._M_single_bucket;
  local_1c0._M_bucket_count = 1;
  local_1c0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_1c0._M_element_count = 0;
  local_1c0._M_rehash_policy._M_max_load_factor = 1.0;
  local_1c0._M_rehash_policy._M_next_resize = 0;
  local_1c0._M_single_bucket = (__node_base_ptr)0x0;
  RegexTree::number_node
            ((unordered_map<const_tree_node_*,_int,_std::hash<const_tree_node_*>,_std::equal_to<const_tree_node_*>,_std::allocator<std::pair<const_tree_node_*const,_int>_>_>
              *)&local_1c0,tree->root,1);
  std::vector<const_tree_node_*,_std::allocator<const_tree_node_*>_>::vector
            (&local_200,local_1c0._M_element_count + 1,(allocator_type *)local_138);
  for (_Var9._M_nxt = local_1c0._M_before_begin._M_nxt; _Var9._M_nxt != (_Hash_node_base *)0x0;
      _Var9._M_nxt = (_Var9._M_nxt)->_M_nxt) {
    local_200.super__Vector_base<const_tree_node_*,_std::allocator<const_tree_node_*>_>._M_impl.
    super__Vector_impl_data._M_start[*(int *)&_Var9._M_nxt[2]._M_nxt] =
         (tree_node *)_Var9._M_nxt[1]._M_nxt;
  }
  local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x0;
  local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (int *)0x0;
  local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  RegexTree::get_followpos(&local_188,tree,(StateMap *)&local_1c0);
  RegexTree::firstpos((StateSet *)&local_170,tree);
  if (local_170._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
    _Var22._M_nxt = local_170._M_before_begin._M_nxt;
    do {
      uVar15 = (ulong)_Var22._M_nxt[1]._M_nxt % local_1c0._M_bucket_count;
      if (local_1c0._M_buckets[uVar15] == (__node_base_ptr)0x0) {
LAB_00104802:
        uVar13 = std::__throw_out_of_range("_Map_base::at");
        std::
        _Hashtable<const_tree_node_*,_const_tree_node_*,_std::allocator<const_tree_node_*>,_std::__detail::_Identity,_std::equal_to<const_tree_node_*>,_std::hash<const_tree_node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::~_Hashtable(&local_170);
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::~vector(&local_188);
        if (local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (int *)0x0) {
          operator_delete(local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (local_200.super__Vector_base<const_tree_node_*,_std::allocator<const_tree_node_*>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_200.
                          super__Vector_base<const_tree_node_*,_std::allocator<const_tree_node_*>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_200.
                                super__Vector_base<const_tree_node_*,_std::allocator<const_tree_node_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_200.
                                super__Vector_base<const_tree_node_*,_std::allocator<const_tree_node_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        std::
        _Hashtable<const_tree_node_*,_std::pair<const_tree_node_*const,_int>,_std::allocator<std::pair<const_tree_node_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<const_tree_node_*>,_std::hash<const_tree_node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable(&local_1c0);
        if (local_2a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          operator_delete(local_2a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_2a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_2a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::~vector(&local_238);
        std::vector<Dstate,_std::allocator<Dstate>_>::~vector(&local_2c8);
        _Unwind_Resume(uVar13);
      }
      p_Var2 = local_1c0._M_buckets[uVar15]->_M_nxt;
      p_Var3 = p_Var2[1]._M_nxt;
      while (_Var22._M_nxt[1]._M_nxt != p_Var3) {
        p_Var2 = p_Var2->_M_nxt;
        if ((p_Var2 == (_Hash_node_base *)0x0) ||
           (p_Var3 = p_Var2[1]._M_nxt, (ulong)p_Var3 % local_1c0._M_bucket_count != uVar15))
        goto LAB_00104802;
      }
      if (local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&local_258,
                   (iterator)
                   local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(int *)(p_Var2 + 2));
      }
      else {
        *local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = *(int *)&p_Var2[2]._M_nxt;
        local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      _Var22._M_nxt = (_Var22._M_nxt)->_M_nxt;
    } while (_Var22._M_nxt != (_Hash_node_base *)0x0);
  }
  piVar5 = local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  piVar20 = local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start;
  if (local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    uVar15 = (long)local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2;
    lVar14 = 0x3f;
    if (uVar15 != 0) {
      for (; uVar15 >> lVar14 == 0; lVar14 = lVar14 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,((uint)lVar14 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (piVar20,piVar5);
  }
  std::vector<int,_std::allocator<int>_>::operator=
            (&(local_2c8.super__Vector_base<Dstate,_std::allocator<Dstate>_>._M_impl.
               super__Vector_impl_data._M_start)->states,&local_258);
  local_138[0]._0_8_ = local_1c0._M_element_count;
  local_1e8 = __return_storage_ptr__;
  _Var10 = std::
           __find_if<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_long_const>>
                     (((local_2c8.super__Vector_base<Dstate,_std::allocator<Dstate>_>._M_impl.
                        super__Vector_impl_data._M_start)->states).
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start);
  if (_Var10._M_current !=
      ((local_2c8.super__Vector_base<Dstate,_std::allocator<Dstate>_>._M_impl.
        super__Vector_impl_data._M_start)->states).super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    local_138[0].mark = 1;
    if (local_2a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish ==
        local_2a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&local_2a8,
                 (iterator)
                 local_2a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,&local_138[0].mark);
    }
    else {
      *local_2a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish = 1;
      local_2a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_2a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
    }
  }
  if ((long)local_2c8.super__Vector_base<Dstate,_std::allocator<Dstate>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_2c8.super__Vector_base<Dstate,_std::allocator<Dstate>_>._M_impl.
            super__Vector_impl_data._M_start != 0) {
    uVar11 = (long)local_2c8.super__Vector_base<Dstate,_std::allocator<Dstate>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_2c8.super__Vector_base<Dstate,_std::allocator<Dstate>_>._M_impl.
                   super__Vector_impl_data._M_start >> 5;
    local_2ac = 0;
    uVar15 = 0;
    do {
      pDVar6 = local_2c8.super__Vector_base<Dstate,_std::allocator<Dstate>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar14 = 0;
      pDVar16 = local_2c8.super__Vector_base<Dstate,_std::allocator<Dstate>_>._M_impl.
                super__Vector_impl_data._M_start;
      do {
        if (pDVar16->mark == -1) {
          local_2ac = (int)lVar14;
          break;
        }
        lVar14 = lVar14 + 1;
        pDVar16 = pDVar16 + 1;
      } while (uVar11 + (uVar11 == 0) != lVar14);
      uVar25 = uVar15 + 1;
      lVar14 = (long)local_2ac;
      local_2c8.super__Vector_base<Dstate,_std::allocator<Dstate>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar14].mark = (int)uVar25;
      local_288 = uVar15;
      memset(local_138,0,0x100);
      local_138[0].states.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)CONCAT17(1,local_138[0].states.super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_start._0_7_);
      piVar21 = pDVar6[lVar14].states.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar18 = pDVar6[lVar14].states.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish;
      local_1d0 = lVar14 * 0x20;
      if (piVar21 != piVar18) {
        local_288 = local_288 + 2;
        local_218 = piVar18;
        local_210 = uVar25;
        do {
          cVar1 = local_200.
                  super__Vector_base<const_tree_node_*,_std::allocator<const_tree_node_*>_>._M_impl.
                  super__Vector_impl_data._M_start[*piVar21]->c;
          lVar14 = (long)cVar1;
          if (*(char *)((long)&local_138[0].mark + lVar14) == '\0') {
            *(undefined1 *)((long)&local_138[0].mark + lVar14) = 1;
            local_2e8 = (int *)0x0;
            iStack_2e0._M_current = (int *)0x0;
            local_2d8 = (int *)0x0;
            piVar18 = *(int **)((long)&((local_2c8.
                                         super__Vector_base<Dstate,_std::allocator<Dstate>_>._M_impl
                                         .super__Vector_impl_data._M_start)->states).
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_start + local_1d0);
            piVar4 = *(int **)((long)&((local_2c8.
                                        super__Vector_base<Dstate,_std::allocator<Dstate>_>._M_impl.
                                        super__Vector_impl_data._M_start)->states).
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_finish + local_1d0);
            local_208 = piVar21;
            if (piVar18 != piVar4) {
              do {
                iVar8 = *piVar18;
                if (local_200.
                    super__Vector_base<const_tree_node_*,_std::allocator<const_tree_node_*>_>.
                    _M_impl.super__Vector_impl_data._M_start[iVar8]->c == cVar1) {
                  piVar5 = local_188.
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[iVar8].
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish;
                  for (piVar20 = local_188.
                                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[iVar8].
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start; piVar20 != piVar5;
                      piVar20 = piVar20 + 1) {
                    local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start =
                         (pointer)CONCAT44(local_278.super__Vector_base<int,_std::allocator<int>_>.
                                           _M_impl.super__Vector_impl_data._M_start._4_4_,*piVar20);
                    _Var12 = std::
                             __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                                       (local_2e8,iStack_2e0._M_current,&local_278);
                    if (_Var12._M_current == iStack_2e0._M_current) {
                      if (_Var12._M_current == local_2d8) {
                        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                                  ((vector<int,std::allocator<int>> *)&local_2e8,iStack_2e0,
                                   (int *)&local_278);
                      }
                      else {
                        *iStack_2e0._M_current =
                             (int)local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start;
                        iStack_2e0._M_current = iStack_2e0._M_current + 1;
                      }
                    }
                  }
                }
                iVar24._M_current = iStack_2e0._M_current;
                piVar21 = local_2e8;
                piVar18 = piVar18 + 1;
              } while (piVar18 != piVar4);
              if (local_2e8 != iStack_2e0._M_current) {
                uVar15 = (long)iStack_2e0._M_current - (long)local_2e8 >> 2;
                lVar19 = 0x3f;
                if (uVar15 != 0) {
                  for (; uVar15 >> lVar19 == 0; lVar19 = lVar19 + -1) {
                  }
                }
                std::
                __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                          (local_2e8,iStack_2e0._M_current,((uint)lVar19 ^ 0x3f) * 2 ^ 0x7e);
                std::
                __final_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                          (piVar21,iVar24._M_current);
              }
            }
            pDVar6 = local_2c8.super__Vector_base<Dstate,_std::allocator<Dstate>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            piVar21 = local_2e8;
            uVar11 = (long)local_2c8.super__Vector_base<Dstate,_std::allocator<Dstate>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)local_2c8.super__Vector_base<Dstate,_std::allocator<Dstate>_>._M_impl.
                           super__Vector_impl_data._M_start;
            local_1c8 = local_2c8.super__Vector_base<Dstate,_std::allocator<Dstate>_>._M_impl.
                        super__Vector_impl_data._M_start;
            pDVar17 = local_2c8.super__Vector_base<Dstate,_std::allocator<Dstate>_>._M_impl.
                      super__Vector_impl_data._M_start;
            uVar15 = uVar11;
            iVar24._M_current = iStack_2e0._M_current;
            if (0 < (long)uVar11 >> 7) {
              sVar23 = (long)iStack_2e0._M_current - (long)local_2e8;
              local_1e0 = (Dstate *)
                          ((long)&(local_2c8.super__Vector_base<Dstate,_std::allocator<Dstate>_>.
                                   _M_impl.super__Vector_impl_data._M_start)->mark +
                          (uVar11 & 0xffffffffffffff80));
              lVar19 = ((long)uVar11 >> 7) + 1;
              pDVar17 = local_2c8.super__Vector_base<Dstate,_std::allocator<Dstate>_>._M_impl.
                        super__Vector_impl_data._M_start + 2;
              local_280 = uVar11;
              local_1d8 = iStack_2e0._M_current;
              do {
                piVar20 = pDVar17[-2].states.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start;
                piVar5 = pDVar17[-2].states.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
                if (((long)piVar5 - (long)piVar20 == sVar23) &&
                   ((piVar5 == piVar20 || (iVar8 = bcmp(piVar20,piVar21,sVar23), iVar8 == 0)))) {
                  pDVar17 = pDVar17 + -2;
                  goto LAB_0010451f;
                }
                piVar20 = pDVar17[-1].states.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start;
                piVar5 = pDVar17[-1].states.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
                if (((long)piVar5 - (long)piVar20 == sVar23) &&
                   ((piVar5 == piVar20 || (iVar8 = bcmp(piVar20,piVar21,sVar23), iVar8 == 0)))) {
                  pDVar17 = pDVar17 + -1;
                  goto LAB_0010451f;
                }
                piVar20 = (pDVar17->states).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start;
                piVar5 = (pDVar17->states).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
                if (((long)piVar5 - (long)piVar20 == sVar23) &&
                   ((piVar5 == piVar20 || (iVar8 = bcmp(piVar20,piVar21,sVar23), iVar8 == 0))))
                goto LAB_0010451f;
                piVar20 = pDVar17[1].states.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start;
                piVar5 = pDVar17[1].states.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
                if (((long)piVar5 - (long)piVar20 == sVar23) &&
                   ((piVar5 == piVar20 || (iVar8 = bcmp(piVar20,piVar21,sVar23), iVar8 == 0)))) {
                  pDVar17 = pDVar17 + 1;
                  goto LAB_0010451f;
                }
                lVar19 = lVar19 + -1;
                pDVar17 = pDVar17 + 4;
              } while (1 < lVar19);
              uVar11 = (long)pDVar6 - (long)local_1e0;
              pDVar17 = local_1e0;
              uVar15 = local_280;
              iVar24._M_current = local_1d8;
            }
            lVar19 = (long)uVar11 >> 5;
            if (lVar19 == 3) {
              piVar20 = (pDVar17->states).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
              piVar5 = (pDVar17->states).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish;
              sVar23 = (long)iVar24._M_current - (long)piVar21;
              if (((long)piVar5 - (long)piVar20 != sVar23) ||
                 ((piVar5 != piVar20 && (iVar8 = bcmp(piVar20,piVar21,sVar23), iVar8 != 0)))) {
                pDVar17 = pDVar17 + 1;
                goto LAB_00104484;
              }
LAB_0010451f:
              local_280 = (ulong)((int)((ulong)((long)pDVar17 - (long)local_1c8) >> 5) + 1);
              piVar18 = local_218;
              piVar21 = local_208;
              uVar25 = local_210;
              if (pDVar17 == pDVar6) goto LAB_00104556;
            }
            else {
              if (lVar19 == 2) {
                sVar23 = (long)iVar24._M_current - (long)piVar21;
LAB_00104484:
                piVar20 = (pDVar17->states).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start;
                piVar5 = (pDVar17->states).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
                if (((long)piVar5 - (long)piVar20 != sVar23) ||
                   ((piVar5 != piVar20 && (iVar8 = bcmp(piVar20,piVar21,sVar23), iVar8 != 0)))) {
                  pDVar17 = pDVar17 + 1;
                  goto LAB_001044b5;
                }
                goto LAB_0010451f;
              }
              if (lVar19 == 1) {
                sVar23 = (long)iVar24._M_current - (long)piVar21;
LAB_001044b5:
                piVar20 = (pDVar17->states).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start;
                piVar5 = (pDVar17->states).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
                if (((long)piVar5 - (long)piVar20 == sVar23) &&
                   ((piVar5 == piVar20 || (iVar8 = bcmp(piVar20,piVar21,sVar23), iVar8 == 0))))
                goto LAB_0010451f;
              }
              local_280 = (ulong)((int)(uVar15 >> 5) + 1);
LAB_00104556:
              piVar21 = local_208;
              uVar25 = local_210;
              piVar18 = local_218;
              if (pDVar6 == local_2c8.super__Vector_base<Dstate,_std::allocator<Dstate>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage) {
                std::vector<Dstate,_std::allocator<Dstate>_>::_M_realloc_insert<>
                          (&local_2c8,(iterator)pDVar6);
              }
              else {
                *(undefined8 *)pDVar6 = 0xffffffff;
                (pDVar6->states).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                (pDVar6->states).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                (pDVar6->states).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                local_2c8.super__Vector_base<Dstate,_std::allocator<Dstate>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_2c8.super__Vector_base<Dstate,_std::allocator<Dstate>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
              local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)local_1c0._M_element_count;
              _Var10 = std::
                       __find_if<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_long_const>>
                                 (local_2e8,iStack_2e0._M_current,&local_278);
              if (_Var10._M_current != iStack_2e0._M_current) {
                iVar8 = (int)((ulong)((long)local_2c8.
                                            super__Vector_base<Dstate,_std::allocator<Dstate>_>.
                                            _M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_2c8.
                                           super__Vector_base<Dstate,_std::allocator<Dstate>_>.
                                           _M_impl.super__Vector_impl_data._M_start) >> 5);
                local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start =
                     (pointer)CONCAT44(local_278.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start._4_4_,iVar8);
                if (local_2a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish ==
                    local_2a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                            (&local_2a8,
                             (iterator)
                             local_2a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish,(int *)&local_278);
                }
                else {
                  *local_2a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish = iVar8;
                  local_2a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       local_2a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish + 1;
                }
              }
              piVar20 = local_2c8.super__Vector_base<Dstate,_std::allocator<Dstate>_>._M_impl.
                        super__Vector_impl_data._M_finish[-1].states.
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
              piVar5 = local_2c8.super__Vector_base<Dstate,_std::allocator<Dstate>_>._M_impl.
                       super__Vector_impl_data._M_finish[-1].states.
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_end_of_storage;
              local_2c8.super__Vector_base<Dstate,_std::allocator<Dstate>_>._M_impl.
              super__Vector_impl_data._M_finish[-1].states.
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
                   = local_2e8;
              local_2c8.super__Vector_base<Dstate,_std::allocator<Dstate>_>._M_impl.
              super__Vector_impl_data._M_finish[-1].states.
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_finish = iStack_2e0._M_current;
              local_2c8.super__Vector_base<Dstate,_std::allocator<Dstate>_>._M_impl.
              super__Vector_impl_data._M_finish[-1].states.
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage = local_2d8;
              local_2e8 = (int *)0x0;
              iStack_2e0._M_current = (int *)0x0;
              local_2d8 = (int *)0x0;
              if (piVar20 != (pointer)0x0) {
                operator_delete(piVar20,(long)piVar5 - (long)piVar20);
              }
            }
            if ((ulong)(((long)local_238.
                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_238.
                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555
                       ) < local_288) {
              local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)operator_new(0x400);
              piVar20 = local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start + 0x100;
              local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = piVar20;
              memset(local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start,0,0x400);
              local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = piVar20;
              std::
              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ::resize(&local_238,local_288,&local_278);
              if (local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (long)local_278.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_278.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start);
              }
            }
            local_238.
            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar25].
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
            [lVar14] = (int)local_280;
            if (local_2e8 != (int *)0x0) {
              operator_delete(local_2e8,(long)local_2d8 - (long)local_2e8);
            }
          }
          piVar21 = piVar21 + 1;
        } while (piVar21 != piVar18);
      }
      uVar11 = (long)local_2c8.super__Vector_base<Dstate,_std::allocator<Dstate>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_2c8.super__Vector_base<Dstate,_std::allocator<Dstate>_>._M_impl.
                     super__Vector_impl_data._M_start >> 5;
      uVar15 = uVar25;
    } while (uVar25 < uVar11);
  }
  pMVar7 = local_1e8;
  MatchTool::MatchTool(local_1e8,&local_238,&local_2a8);
  std::
  _Hashtable<const_tree_node_*,_const_tree_node_*,_std::allocator<const_tree_node_*>,_std::__detail::_Identity,_std::equal_to<const_tree_node_*>,_std::hash<const_tree_node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_170);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_188);
  if (local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_200.super__Vector_base<const_tree_node_*,_std::allocator<const_tree_node_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_200.
                    super__Vector_base<const_tree_node_*,_std::allocator<const_tree_node_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_200.
                          super__Vector_base<const_tree_node_*,_std::allocator<const_tree_node_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_200.
                          super__Vector_base<const_tree_node_*,_std::allocator<const_tree_node_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Hashtable<const_tree_node_*,_std::pair<const_tree_node_*const,_int>,_std::allocator<std::pair<const_tree_node_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<const_tree_node_*>,_std::hash<const_tree_node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_1c0);
  if (local_2a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_2a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_238);
  std::vector<Dstate,_std::allocator<Dstate>_>::~vector(&local_2c8);
  return pMVar7;
}

Assistant:

MatchTool generate_Dtran(const RegexTree& tree) {
    std::vector<Dstate> Dstates(1, Dstate());
    std::vector<std::vector<int>> Dtran;
    std::vector<int> targets;
    RegexTree::StateMap mp;
    tree.number_node(mp);
    std::vector<const tree_node *> table(mp.size() + 1);
    for (const auto &p : mp)
        table[p.second] = p.first;
    std::vector<int> firstpos;
    RegexTree::FollowPos fp = tree.get_followpos(mp);
    int is_marked = 0;
    int curr = 0;

    RegexTree::StateSet first_set = tree.firstpos();
    for (const tree_node *p : first_set) firstpos.push_back(mp.at(p));
    std::sort(firstpos.begin(), firstpos.end());
    Dstates.front().states = firstpos;
    if (std::find(Dstates.front().states.cbegin(),
            Dstates.front().states.cend(), mp.size()) != Dstates.front().states.cend())
        targets.push_back(1);

    while (is_marked < Dstates.size()) {
        for (int i = 0; i < Dstates.size(); i++)
            if (Dstates[i].mark == -1) {
                curr = i;
                break;
            }
        ++is_marked;
        Dstates[curr].mark = is_marked; // mark this state

        bool alphabet[256];
        for (bool &i : alphabet)
            i = false;
        alphabet[ACCEPT] = true;

        for (int state : Dstates[curr].states) {
            char ch = table[state]->c;
            if (alphabet[ch])
                continue;
            else
                alphabet[ch] = true;

            std::vector<int> tmp;
            for (int state2 : Dstates[curr].states) {
                if (table[state2]->c == ch)
                    for (int j : fp[state2]) {
                        if (std::find(tmp.begin(), tmp.end(), j) == tmp.end())
                            tmp.push_back(j);
                    }
            }
            std::sort(tmp.begin(), tmp.end());

            auto iter = std::find_if(Dstates.begin(), Dstates.end(), [&tmp](Dstate &s) {
                return s.states == tmp;
            });
            int state_num = static_cast<int>(iter - Dstates.begin()) + 1;
            if (iter == Dstates.end()) {
                Dstates.emplace_back();
                if (std::find(tmp.cbegin(), tmp.cend(), mp.size()) != tmp.cend())
                    targets.push_back(static_cast<int>(Dstates.size()));
                Dstates.back().states = std::move(tmp);
            }
            if (Dtran.size() < is_marked + 1)
                Dtran.resize(static_cast<unsigned long>(is_marked + 1) // NOLINT
                        , std::vector<int>(256, 0));
            Dtran[is_marked][ch] = state_num;
        }
    }
    return MatchTool(std::move(Dtran), std::move(targets));
}